

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.c
# Opt level: O0

void ly_ctx_destroy(ly_ctx *ctx,_func_void_lys_node_ptr_void_ptr *private_destructor)

{
  int local_1c;
  int i;
  _func_void_lys_node_ptr_void_ptr *private_destructor_local;
  ly_ctx *ctx_local;
  
  if (ctx != (ly_ctx *)0x0) {
    while (0 < (ctx->models).used) {
      lys_sub_module_remove_devs_augs((ctx->models).list[(ctx->models).used + -1]);
      lys_free((ctx->models).list[(ctx->models).used + -1],private_destructor,1,0);
      (ctx->models).used = (ctx->models).used + -1;
    }
    if ((ctx->models).search_paths != (char **)0x0) {
      for (local_1c = 0; (ctx->models).search_paths[local_1c] != (char *)0x0;
          local_1c = local_1c + 1) {
        free((ctx->models).search_paths[local_1c]);
      }
      free((ctx->models).search_paths);
    }
    free((ctx->models).list);
    ly_err_clean(ctx,(ly_err_item *)0x0);
    pthread_key_delete(ctx->errlist_key);
    lydict_clean(&ctx->dict);
    ly_clean_plugins();
    free(ctx);
  }
  return;
}

Assistant:

API void
ly_ctx_destroy(struct ly_ctx *ctx, void (*private_destructor)(const struct lys_node *node, void *priv))
{
    int i;

    if (!ctx) {
        return;
    }

    /* models list */
    for (; ctx->models.used > 0; ctx->models.used--) {
        /* remove the applied deviations and augments */
        lys_sub_module_remove_devs_augs(ctx->models.list[ctx->models.used - 1]);
        /* remove the module */
        lys_free(ctx->models.list[ctx->models.used - 1], private_destructor, 1, 0);
    }
    if (ctx->models.search_paths) {
        for(i = 0; ctx->models.search_paths[i]; i++) {
            free(ctx->models.search_paths[i]);
        }
        free(ctx->models.search_paths);
    }
    free(ctx->models.list);

    /* clean the error list */
    ly_err_clean(ctx, 0);
    pthread_key_delete(ctx->errlist_key);

    /* dictionary */
    lydict_clean(&ctx->dict);

    /* plugins - will be removed only if this is the last context */
    ly_clean_plugins();

    free(ctx);
}